

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conway-cubes.cpp
# Opt level: O2

object_t<2UL,_char> *
make<2ul,char>(object_t<2UL,_char> *__return_storage_ptr__,size_t N,char *value)

{
  allocator_type local_31;
  _Vector_base<char,_std::allocator<char>_> local_30;
  
  make<1ul,char>((object_t<1UL,_char> *)&local_30,N,value);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,N,(value_type *)&local_30,&local_31);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

auto make(size_t N, const T& value) {
  if constexpr (Dim > 1) {
    return object_t<Dim, T>(N, make<Dim-1, T>(N, value));
  } else {
    return object_t<Dim, T>(N, value);
  }
}